

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_record.cc
# Opt level: O0

char * __thiscall RecordField::FieldSize(RecordField *this,Output *out_cc,Env *env)

{
  int iVar1;
  int iVar2;
  DataPtr *this_00;
  DataPtr *this_01;
  ID *pIVar3;
  ID *pIVar4;
  Env *pEVar5;
  char *pcVar6;
  char *pcVar7;
  Env *in_RDI;
  DataPtr *end;
  DataPtr *begin;
  Output *in_stack_00000050;
  RecordField *in_stack_00000058;
  Output *in_stack_ffffffffffffffd0;
  RecordField *in_stack_ffffffffffffffd8;
  Env *local_8;
  
  if (in_RDI[3].parent == (Env *)0x0) {
    this_00 = getFieldBegin(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_RDI);
    this_01 = getFieldEnd(in_stack_00000058,in_stack_00000050,(Env *)this);
    pIVar3 = DataPtr::id(this_00);
    pIVar4 = DataPtr::id(this_01);
    if (pIVar3 == pIVar4) {
      iVar1 = DataPtr::offset(this_01);
      iVar2 = DataPtr::offset(this_00);
      pEVar5 = (Env *)nfmt("%d",(ulong)(uint)(iVar1 - iVar2));
      in_RDI[3].parent = pEVar5;
    }
    else {
      pcVar6 = DataPtr::ptr_expr((DataPtr *)0x14662c);
      pcVar7 = DataPtr::ptr_expr((DataPtr *)0x14663b);
      pEVar5 = (Env *)nfmt("(%s - %s)",pcVar6,pcVar7);
      in_RDI[3].parent = pEVar5;
    }
    local_8 = in_RDI[3].parent;
  }
  else {
    local_8 = in_RDI[3].parent;
  }
  return (char *)local_8;
}

Assistant:

const char* RecordField::FieldSize(Output* out_cc, Env* env)
	{
	if ( field_size_expr )
		return field_size_expr;

	const DataPtr& begin = getFieldBegin(out_cc, env);
	const DataPtr& end = getFieldEnd(out_cc, env);
	if ( begin.id() == end.id() )
		field_size_expr = nfmt("%d", end.offset() - begin.offset());
	else
		field_size_expr = nfmt("(%s - %s)", end.ptr_expr(), begin.ptr_expr());
	return field_size_expr;
	}